

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.h
# Opt level: O1

void __thiscall piece_data::add_piece(piece_data *this,Color *c,Piece *p,Square *s,info *ifo)

{
  unsigned_long *puVar1;
  Square SVar2;
  Color CVar3;
  Piece PVar4;
  int iVar5;
  ulong uVar6;
  U64 UVar7;
  
  SVar2 = *s;
  uVar6 = (&bitboards::squares)[SVar2];
  CVar3 = *c;
  puVar1 = (this->bycolor)._M_elems + CVar3;
  *puVar1 = *puVar1 | uVar6;
  PVar4 = *p;
  puVar1 = (this->bitmap)._M_elems[CVar3]._M_elems + PVar4;
  *puVar1 = *puVar1 | uVar6;
  iVar5 = (this->number_of)._M_elems[CVar3]._M_elems[PVar4];
  (this->number_of)._M_elems[CVar3]._M_elems[PVar4] = iVar5 + 1;
  (this->square_of)._M_elems[CVar3]._M_elems[PVar4]._M_elems[(long)iVar5 + 1] = SVar2;
  SVar2 = *s;
  (this->piece_on)._M_elems[SVar2] = PVar4;
  (this->piece_idx)._M_elems[CVar3]._M_elems[*p]._M_elems[SVar2] =
       (this->number_of)._M_elems[CVar3]._M_elems[*p];
  (this->color_on)._M_elems[SVar2] = CVar3;
  UVar7 = zobrist::piece(s,c,p);
  ifo->key = ifo->key ^ UVar7;
  UVar7 = zobrist::piece(s,c,p);
  ifo->mkey = ifo->mkey ^ UVar7;
  UVar7 = zobrist::piece(s,c,p);
  ifo->repkey = ifo->repkey ^ UVar7;
  if (*p == pawn) {
    UVar7 = zobrist::piece(s,c,p);
    ifo->pawnkey = ifo->pawnkey ^ UVar7;
  }
  return;
}

Assistant:

inline void piece_data::add_piece(const Color& c, const Piece& p, const Square& s, info& ifo) {
	U64 sq = bitboards::squares[s];
	bycolor[c] |= sq;
	bitmap[c][p] |= sq;

	number_of[c][p] += 1;
	square_of[c][p][number_of[c][p]] = s;
	piece_on[s] = p;
	piece_idx[c][p][s] = number_of[c][p];
	color_on[s] = c;
	ifo.key ^= zobrist::piece(s, c, p);
	ifo.mkey ^= zobrist::piece(s, c, p);
	ifo.repkey ^= zobrist::piece(s, c, p);
	if (p == Piece::pawn) ifo.pawnkey ^= zobrist::piece(s, c, p);
}